

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::GetTargetVersion
          (cmGeneratorTarget *this,bool soversion,int *major,int *minor,int *patch)

{
  int iVar1;
  char *pcVar2;
  int parsed_patch;
  int parsed_minor;
  int parsed_major;
  int local_58;
  int local_54;
  string local_50;
  
  *major = 0;
  *minor = 0;
  *patch = 0;
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x1022,
                  "void cmGeneratorTarget::GetTargetVersion(bool, int &, int &, int &) const");
  }
  pcVar2 = "VERSION";
  if (soversion) {
    pcVar2 = "SOVERSION";
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,pcVar2,pcVar2 + (ulong)soversion * 2 + 7);
  pcVar2 = GetProperty(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (pcVar2 != (char *)0x0) {
    iVar1 = __isoc99_sscanf(pcVar2,"%d.%d.%d",&local_50,&local_54,&local_58);
    if (iVar1 != 1) {
      if (iVar1 != 2) {
        if (iVar1 != 3) {
          return;
        }
        *patch = local_58;
      }
      *minor = local_54;
    }
    *major = (int)local_50._M_dataplus._M_p;
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(bool soversion, int& major,
                                         int& minor, int& patch) const
{
  // Set the default values.
  major = 0;
  minor = 0;
  patch = 0;

  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  // Look for a VERSION or SOVERSION property.
  const char* prop = soversion ? "SOVERSION" : "VERSION";
  if (const char* version = this->GetProperty(prop)) {
    // Try to parse the version number and store the results that were
    // successfully parsed.
    int parsed_major;
    int parsed_minor;
    int parsed_patch;
    switch (sscanf(version, "%d.%d.%d", &parsed_major, &parsed_minor,
                   &parsed_patch)) {
      case 3:
        patch = parsed_patch;
        CM_FALLTHROUGH;
      case 2:
        minor = parsed_minor;
        CM_FALLTHROUGH;
      case 1:
        major = parsed_major;
        CM_FALLTHROUGH;
      default:
        break;
    }
  }
}